

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImDrawList::_CalcCircleAutoSegmentCount(ImDrawList *this,float radius)

{
  float fVar1;
  int radius_idx;
  float radius_local;
  ImDrawList *this_local;
  
  if ((int)(radius + 0.999999) < 0x40) {
    this_local._4_4_ = (uint)this->_Data->CircleSegmentCounts[(int)(radius + 0.999999)];
  }
  else {
    fVar1 = ImMin<float>(this->_Data->CircleSegmentMaxError,radius);
    fVar1 = acosf(1.0 - fVar1 / radius);
    fVar1 = ceilf(3.1415927 / fVar1);
    this_local._4_4_ = ImClamp<int>(((int)fVar1 + 1) / 2 << 1,4,0x200);
  }
  return this_local._4_4_;
}

Assistant:

int ImDrawList::_CalcCircleAutoSegmentCount(float radius) const
{
    // Automatic segment count
    const int radius_idx = (int)(radius + 0.999999f); // ceil to never reduce accuracy
    if (radius_idx < IM_ARRAYSIZE(_Data->CircleSegmentCounts))
        return _Data->CircleSegmentCounts[radius_idx]; // Use cached value
    else
        return IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, _Data->CircleSegmentMaxError);
}